

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution1d.cpp
# Opt level: O0

int __thiscall
ncnn::Deconvolution1D::forward(Deconvolution1D *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  Mat *in_RDX;
  long in_RSI;
  Mat *in_RDI;
  bool bVar3;
  int ret;
  Mat top_blob_bordered;
  int outw;
  int kernel_extent_w;
  size_t elemsize;
  int in_stack_000000f0;
  int w;
  Allocator *in_stack_fffffffffffffe48;
  size_t in_stack_fffffffffffffe50;
  undefined8 in_stack_fffffffffffffe58;
  Mat *pMVar4;
  undefined7 in_stack_fffffffffffffe60;
  undefined1 in_stack_fffffffffffffe67;
  Mat *in_stack_fffffffffffffe68;
  undefined7 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe77;
  undefined4 in_stack_fffffffffffffe7c;
  uint uVar5;
  bool local_171;
  Mat local_130;
  int local_e8;
  int local_e4;
  undefined8 local_e0;
  int local_d4;
  Mat *local_c8;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  Mat *in_stack_ffffffffffffff60;
  
  local_d4 = *(int *)(in_RSI + 0x2c);
  local_e0 = *(undefined8 *)(in_RSI + 0x10);
  local_e4 = *(int *)&in_RDI[3].data * (*(int *)((long)&in_RDI[2].cstep + 4) + -1) + 1;
  local_e8 = (local_d4 + -1) * *(int *)((long)&in_RDI[3].data + 4) + local_e4 +
             (int)in_RDI[3].elemsize;
  pMVar4 = &local_130;
  local_130.data = (void *)0x0;
  local_130.refcount = (int *)0x0;
  local_130.elemsize = 0;
  local_130.elempack = 0;
  local_130.allocator = (Allocator *)0x0;
  local_130.dims = 0;
  local_130.w = 0;
  local_130.h = 0;
  local_130.d = 0;
  local_130.c = 0;
  local_130.cstep = 0;
  iVar2 = (int)((ulong)in_stack_fffffffffffffe58 >> 0x20);
  local_c8 = in_RDX;
  if (((*(int *)&in_RDI[3].refcount < 1) && (*(int *)((long)&in_RDI[3].refcount + 4) < 1)) &&
     (*(int *)((long)&in_RDI[3].elemsize + 4) < 1)) {
    if (&local_130 != in_RDX) {
      if (in_RDX->refcount != (int *)0x0) {
        LOCK();
        *in_RDX->refcount = *in_RDX->refcount + 1;
        UNLOCK();
      }
      local_130.data = in_RDX->data;
      local_130.refcount = in_RDX->refcount;
      local_130.elemsize = in_RDX->elemsize;
      local_130.elempack = in_RDX->elempack;
      local_130.allocator = in_RDX->allocator;
      local_130.dims = in_RDX->dims;
      local_130.w = in_RDX->w;
      local_130.h = in_RDX->h;
      local_130.d = in_RDX->d;
      local_130.c = in_RDX->c;
      local_130.cstep = in_RDX->cstep;
    }
    Mat::create((Mat *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),iVar2,
                (int)in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  }
  else {
    Mat::create((Mat *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),iVar2,
                (int)in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  }
  local_171 = local_130.data == (void *)0x0 || local_130.cstep * (long)local_130.c == 0;
  uVar5 = CONCAT13(local_171,(int3)in_stack_fffffffffffffe7c);
  if (local_171) {
    iVar2 = -100;
  }
  else {
    iVar2 = deconvolution1d(in_stack_ffffffffffffff60,pMVar4,
                            (Mat *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                            in_RDI,(int)((ulong)in_RSI >> 0x20),(int)in_RSI,in_stack_000000f0,
                            (int)opt,top_blob,(Option *)bottom_blob);
    if (iVar2 == 0) {
      cut_padding((Deconvolution1D *)((ulong)uVar5 << 0x20),
                  (Mat *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
                  in_stack_fffffffffffffe68,
                  (Option *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
      bVar3 = true;
      if (local_c8->data != (void *)0x0) {
        bVar3 = local_c8->cstep * (long)local_c8->c == 0;
      }
      if (bVar3) {
        iVar2 = -100;
      }
      else {
        iVar2 = 0;
      }
    }
  }
  pMVar4 = &local_130;
  if (local_130.refcount != (int *)0x0) {
    LOCK();
    iVar1 = *local_130.refcount;
    *local_130.refcount = *local_130.refcount + -1;
    UNLOCK();
    if (iVar1 == 1) {
      if (local_130.allocator == (Allocator *)0x0) {
        if (local_130.data != (void *)0x0) {
          free(local_130.data);
        }
      }
      else {
        (*(local_130.allocator)->_vptr_Allocator[3])(local_130.allocator,local_130.data);
      }
    }
  }
  pMVar4->data = (void *)0x0;
  pMVar4->elemsize = 0;
  pMVar4->elempack = 0;
  pMVar4->dims = 0;
  pMVar4->w = 0;
  pMVar4->h = 0;
  pMVar4->d = 0;
  pMVar4->c = 0;
  pMVar4->cstep = 0;
  pMVar4->refcount = (int *)0x0;
  return iVar2;
}

Assistant:

int Deconvolution1D::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || output_w > 0)
    {
        top_blob_bordered.create(outw, num_output, elemsize, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, num_output, elemsize, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    int ret = deconvolution1d(bottom_blob, top_blob_bordered, weight_data, bias_data, kernel_w, stride_w, dilation_w, activation_type, activation_params, opt);
    if (ret != 0)
        return ret;

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}